

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O0

void __thiscall TUPU::TImage::TImage(TImage *this,TImage *img)

{
  long in_RSI;
  undefined8 *in_RDI;
  string *in_stack_ffffffffffffffa8;
  string *this_00;
  string *this_01;
  TImage *this_02;
  
  *in_RDI = &PTR__TImage_00511ce8;
  this_00 = (string *)(in_RDI + 1);
  std::__cxx11::string::string(this_00);
  this_01 = (string *)(in_RDI + 5);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string((string *)(in_RDI + 9));
  this_02 = (TImage *)(in_RDI + 0xd);
  std::__cxx11::string::string((string *)this_02);
  in_RDI[0x12] = 0;
  in_RDI[0x13] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x14));
  std::__cxx11::string::operator=((string *)(in_RDI + 9),(string *)(in_RSI + 0x48));
  std::__cxx11::string::operator=((string *)(in_RDI + 0xd),(string *)(in_RSI + 0x68));
  if (*(long *)(in_RSI + 0x90) == 0) {
    std::__cxx11::string::operator=((string *)(in_RDI + 1),(string *)(in_RSI + 8));
    std::__cxx11::string::operator=((string *)(in_RDI + 5),(string *)(in_RSI + 0x28));
  }
  else {
    setBinary(this_02,this_01,(size_t)this_00,in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

TImage::TImage(const TImage & img)
    : m_buffer(NULL)
    , m_len(0)
{
    m_tag = img.m_tag;
    m_sequenceId = img.m_sequenceId;
    if (img.m_buffer) {
        setBinary(img.m_buffer, img.m_len, img.m_filename);
    } else {
        m_url = img.m_url;
        m_path = img.m_path;
    }
}